

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

MapinfoSpawnItem * __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Insert
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          int key,MapinfoSpawnItem *value)

{
  Node *local_28;
  Node *n;
  MapinfoSpawnItem *value_local;
  int key_local;
  TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this_local;
  
  local_28 = FindKey(this,key);
  if (local_28 == (Node *)0x0) {
    local_28 = NewKey(this,key);
    MapinfoSpawnItem::MapinfoSpawnItem(&(local_28->Pair).Value,value);
  }
  else {
    MapinfoSpawnItem::operator=(&(local_28->Pair).Value,value);
  }
  return &(local_28->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}